

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall just::file::impl::output_file::output_file(output_file *this,string *filename_)

{
  char *__filename;
  FILE *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_18;
  string *filename__local;
  output_file *this_local;
  
  local_18 = filename_;
  filename__local = &this->_filename;
  std::__cxx11::string::string((string *)this,(string *)filename_);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"wb");
  this->_f = (FILE *)pFVar1;
  if (this->_f == (FILE *)0x0) {
    std::operator+(&local_48,"Error creating file ",local_18);
    throw_errno(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

explicit output_file(const std::string& filename_) :
          _filename(filename_),
          _f(std::fopen(filename_.c_str(), "wb"))
        {
          if (!_f)
          {
            throw_errno("Error creating file " + filename_);
          }
        }